

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

void __thiscall
wasm::Wasm2JSBuilder::Wasm2JSBuilder(Wasm2JSBuilder *this,Flags *f,PassOptions *options_)

{
  unordered_set<wasm::IString,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<wasm::IString>_>
  *local_78;
  unordered_map<const_void_*,_wasm::IString,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>_>
  *local_60;
  PassOptions *options__local;
  Flags *f_local;
  Wasm2JSBuilder *this_local;
  
  std::
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  ::unordered_map(&this->dataIndices);
  Flags::Flags(&this->flags,f);
  PassOptions::PassOptions(&this->options,options_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->temps);
  std::
  vector<std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::allocator<std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>
  ::vector(&this->frees);
  local_60 = this->wasmNameToMangledName;
  do {
    std::
    unordered_map<const_void_*,_wasm::IString,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>_>
    ::unordered_map(local_60);
    local_60 = local_60 + 1;
  } while (local_60 !=
           (unordered_map<const_void_*,_wasm::IString,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_wasm::IString>_>_>
            *)this->mangledNames);
  local_78 = this->mangledNames;
  do {
    std::
    unordered_set<wasm::IString,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<wasm::IString>_>
    ::unordered_set(local_78);
    local_78 = local_78 + 1;
  } while (local_78 != &this->seenModuleImports);
  std::
  unordered_set<wasm::IString,_std::hash<wasm::IString>,_std::equal_to<wasm::IString>,_std::allocator<wasm::IString>_>
  ::unordered_set(&this->seenModuleImports);
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set(&this->functionsCallableFromOutside);
  if (0 < (this->options).optimizeLevel) {
    (this->options).ignoreImplicitTraps = true;
    (this->options).targetJS = true;
  }
  return;
}

Assistant:

Wasm2JSBuilder(Flags f, PassOptions options_) : flags(f), options(options_) {
    // We don't try to model wasm's trapping precisely - if we did, each load
    // and store would need to do a check. Given that, we can just ignore
    // implicit traps like those when optimizing. (When not optimizing, it's
    // nice to see codegen that matches wasm more precisely.)
    // It is also important to prevent the optimizer from adding new things that
    // require additional lowering, as we could hit a cycle.
    if (options.optimizeLevel > 0) {
      options.ignoreImplicitTraps = true;
      options.targetJS = true;
    }
  }